

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O0

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
::find(RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
       *this,RBPath *path,K value)

{
  bool bVar1;
  K KVar2;
  RBPath *in_RDX;
  bool dir;
  RBPath *in_stack_ffffffffffffffb8;
  ChildRef in_stack_ffffffffffffffc0;
  
  RBPath::curr(in_stack_ffffffffffffffb8);
  bVar1 = ChildRef::is_null((ChildRef *)in_stack_ffffffffffffffc0.ptr.val);
  if (!bVar1) {
    do {
      RBPath::curr(in_stack_ffffffffffffffb8);
      KVar2 = snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                        ((ChildRef *)in_stack_ffffffffffffffc0.ptr.val);
      bVar1 = BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
              ::equal(KVar2,(Contents)in_RDX);
      if (bVar1) {
        return true;
      }
      in_stack_ffffffffffffffc0 = RBPath::curr(in_stack_ffffffffffffffb8);
      KVar2 = snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                        ((ChildRef *)in_stack_ffffffffffffffc0.ptr.val);
      bVar1 = BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
              ::compare(KVar2,(Contents)in_RDX);
      bVar1 = RBPath::move_inc_null(in_RDX,bVar1);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool find(RBPath& path, K value)
    {
      bool dir;

      if (path.curr().is_null())
        return false;

      do
      {
        if (Rep::equal(path.curr(), value))
          return true;
        dir = Rep::compare(path.curr(), value);
      } while (path.move_inc_null(dir));

      return false;
    }